

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O0

shared_ptr<PathTracer>
PathTracer::Create(shared_ptr<Octree> *octree,shared_ptr<Camera> *camera,
                  shared_ptr<Lighting> *lighting,shared_ptr<myvk::CommandPool> *command_pool)

{
  element_type *peVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<PathTracer> sVar3;
  shared_ptr<myvk::Device> *in_stack_00000008;
  PathTracer *in_stack_00000010;
  shared_ptr<PathTracer> *ret;
  shared_ptr<myvk::Device> *in_stack_00000178;
  PathTracer *in_stack_00000180;
  shared_ptr<myvk::CommandPool> *in_stack_000002c8;
  PathTracer *in_stack_000002d0;
  shared_ptr<myvk::Device> *in_stack_00009408;
  Sobol *in_stack_00009410;
  shared_ptr<myvk::Device> *in_stack_0000e138;
  PathTracer *in_stack_0000e140;
  shared_ptr<Camera> *in_stack_ffffffffffffff58;
  shared_ptr<Camera> *in_stack_ffffffffffffff60;
  
  std::make_shared<PathTracer>();
  std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x17081d);
  std::shared_ptr<Octree>::operator=
            ((shared_ptr<Octree> *)in_stack_ffffffffffffff60,
             (shared_ptr<Octree> *)in_stack_ffffffffffffff58);
  std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x170841);
  std::shared_ptr<Camera>::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x170869);
  std::shared_ptr<Lighting>::operator=
            ((shared_ptr<Lighting> *)in_stack_ffffffffffffff60,
             (shared_ptr<Lighting> *)in_stack_ffffffffffffff58);
  peVar1 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x170884);
  peVar1->m_bounce = 4;
  std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x170898);
  peVar2 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1708ae);
  (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  Sobol::Initialize(in_stack_00009410,in_stack_00009408);
  std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1708dc);
  peVar2 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1708ee);
  (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  create_noise_images(in_stack_00000010,in_stack_00000008);
  std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x17091c);
  set_noise_image(in_stack_000002d0,in_stack_000002c8);
  std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x170938);
  peVar2 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x17094a);
  (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  create_descriptor(in_stack_00000180,in_stack_00000178);
  std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x170978);
  peVar2 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x170989);
  (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  create_pipeline(in_stack_0000e140,in_stack_0000e138);
  sVar3.super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<PathTracer>)sVar3.super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PathTracer> PathTracer::Create(const std::shared_ptr<Octree> &octree,
                                               const std::shared_ptr<Camera> &camera,
                                               const std::shared_ptr<Lighting> &lighting,
                                               const std::shared_ptr<myvk::CommandPool> &command_pool) {
	std::shared_ptr<PathTracer> ret = std::make_shared<PathTracer>();
	ret->m_octree_ptr = octree;
	ret->m_camera_ptr = camera;
	ret->m_lighting_ptr = lighting;

	ret->m_bounce = kDefaultBounce;

	ret->m_sobol.Initialize(command_pool->GetDevicePtr());
	ret->create_noise_images(command_pool->GetDevicePtr());
	ret->set_noise_image(command_pool);
	ret->create_descriptor(command_pool->GetDevicePtr());
	ret->create_pipeline(command_pool->GetDevicePtr());

	return ret;
}